

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpost.c
# Opt level: O3

FT_Error load_post_names(TT_Face face)

{
  byte bVar1;
  FT_Stream stream;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  FT_UInt16 FVar4;
  FT_Error FVar5;
  FT_UShort *pFVar6;
  FT_Byte *buffer;
  ulong uVar7;
  FT_Char **P;
  uint uVar8;
  ushort uVar9;
  FT_Memory memory;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  FT_ULong post_len;
  FT_Error local_5c;
  FT_UShort *local_58;
  FT_Memory local_50;
  FT_Char **local_48;
  FT_ULong local_40;
  ulong local_38;
  
  stream = (face->root).stream;
  FVar5 = (*face->goto_table)(face,0x706f7374,stream,&local_38);
  if (FVar5 != 0) {
    return FVar5;
  }
  lVar14 = (face->postscript).FormatType;
  FVar5 = FT_Stream_Skip(stream,0x20);
  if (FVar5 != 0) {
    return FVar5;
  }
  if (local_38 < 0x22 || lVar14 != 0x20000) {
    FVar5 = 3;
    if (lVar14 != 0x25000 || local_38 < 0x22) goto LAB_00249387;
    memory = stream->memory;
    FVar4 = FT_Stream_ReadUShort(stream,&local_5c);
    FVar5 = local_5c;
    if (local_5c != 0) goto LAB_00249387;
    uVar13 = (ulong)FVar4;
    FVar5 = 3;
    if ((0x102 < FVar4) || ((face->max_profile).numGlyphs <= (ushort)(FVar4 - 1)))
    goto LAB_00249387;
    pFVar6 = (FT_UShort *)ft_mem_qrealloc(memory,1,0,uVar13,(void *)0x0,&local_5c);
    if ((local_5c == 0) &&
       (local_5c = FT_Stream_Read(stream,(FT_Byte *)pFVar6,uVar13), local_5c == 0)) {
      uVar7 = 0;
      do {
        if (uVar13 < (long)(char)*(FT_Byte *)((long)pFVar6 + uVar7) + uVar7) {
          local_5c = 3;
          goto LAB_0024937e;
        }
        uVar7 = uVar7 + 1;
      } while (uVar13 != uVar7);
      (face->postscript_names).names.format_20.num_glyphs = FVar4;
      (face->postscript_names).names.format_25.offsets = (FT_Char *)pFVar6;
      goto LAB_002493d1;
    }
  }
  else {
    local_50 = stream->memory;
    FVar4 = FT_Stream_ReadUShort(stream,&local_5c);
    memory = local_50;
    FVar5 = local_5c;
    if ((local_5c != 0) || (FVar5 = 3, (face->max_profile).numGlyphs < FVar4)) goto LAB_00249387;
    uVar7 = (ulong)FVar4;
    local_40 = (FT_ULong)((uint)FVar4 + (uint)FVar4);
    uVar13 = (local_38 - 0x22) - local_40;
    if (local_38 - 0x22 < local_40) goto LAB_00249387;
    pFVar6 = (FT_UShort *)ft_mem_qrealloc(local_50,2,0,uVar7,(void *)0x0,&local_5c);
    buffer = (FT_Byte *)0x0;
    P = (FT_Char **)0x0;
    if (local_5c == 0) {
      local_58 = pFVar6;
      local_5c = FT_Stream_EnterFrame(stream,local_40);
      pFVar6 = local_58;
      if (local_5c == 0) {
        if (FVar4 == 0) {
          FT_Stream_ExitFrame(stream);
          uVar9 = 0;
          local_48 = (FT_Char **)0x0;
          local_40._0_2_ = 0;
        }
        else {
          local_40 = CONCAT62(local_40._2_6_,FVar4);
          uVar10 = 0;
          do {
            FVar4 = FT_Stream_GetUShort(stream);
            pFVar6[uVar10] = FVar4;
            uVar10 = uVar10 + 1;
          } while (uVar7 != uVar10);
          FT_Stream_ExitFrame(stream);
          memory = local_50;
          uVar10 = 0;
          uVar11 = 0;
          do {
            uVar8 = uVar11 & 0xffff;
            uVar11 = pFVar6[uVar10] - 0x101;
            if ((int)uVar11 <= (int)uVar8) {
              uVar11 = uVar8;
            }
            if (pFVar6[uVar10] < 0x102) {
              uVar11 = uVar8;
            }
            uVar9 = (ushort)uVar11;
            uVar10 = uVar10 + 1;
          } while (uVar7 != uVar10);
          if (uVar9 != 0) {
            buffer = (FT_Byte *)ft_mem_qalloc(local_50,uVar13 + 1,&local_5c);
            if (local_5c == 0) {
              local_5c = FT_Stream_Read(stream,buffer,uVar13);
              if (local_5c == 0) {
                uVar7 = (ulong)(uVar11 & 0xffff);
                P = (FT_Char **)ft_mem_qrealloc(local_50,8,0,uVar7,(void *)0x0,&local_5c);
                pFVar6 = local_58;
                memory = local_50;
                local_48 = P;
                if (local_5c == 0) {
                  if (uVar13 == 0) {
                    *buffer = '\0';
                    uVar13 = 1;
                    buffer = (FT_Byte *)ft_mem_qrealloc(local_50,1,1,2,buffer,&local_5c);
                    pFVar6 = local_58;
                    memory = local_50;
                    P = local_48;
                    if (local_5c != 0) goto LAB_002491d2;
                    buffer[1] = '\0';
                    uVar12 = 0;
LAB_002494d4:
                    auVar3 = _DAT_002f57d0;
                    auVar2 = _DAT_002ef930;
                    if ((ushort)uVar12 < uVar9) {
                      uVar12 = uVar12 & 0xffff;
                      lVar14 = (uVar7 - uVar12) + -1;
                      auVar15._8_4_ = (int)lVar14;
                      auVar15._0_8_ = lVar14;
                      auVar15._12_4_ = (int)((ulong)lVar14 >> 0x20);
                      uVar10 = 0;
                      auVar15 = auVar15 ^ _DAT_002ef930;
                      do {
                        auVar16._8_4_ = (int)uVar10;
                        auVar16._0_8_ = uVar10;
                        auVar16._12_4_ = (int)(uVar10 >> 0x20);
                        auVar16 = (auVar16 | auVar3) ^ auVar2;
                        if ((bool)(~(auVar16._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar16._0_4_
                                    || auVar15._4_4_ < auVar16._4_4_) & 1)) {
                          local_48[uVar12 + uVar10] = (FT_Char *)(buffer + uVar13);
                        }
                        if ((auVar16._12_4_ != auVar15._12_4_ || auVar16._8_4_ <= auVar15._8_4_) &&
                            auVar16._12_4_ <= auVar15._12_4_) {
                          local_48[uVar12 + uVar10 + 1] = (FT_Char *)(buffer + uVar13);
                        }
                        uVar10 = uVar10 + 2;
                      } while (((uVar7 - uVar12) + 1 & 0xfffffffffffffffe) != uVar10);
                    }
                  }
                  else {
                    uVar12 = 0;
                    uVar10 = 0;
                    do {
                      bVar1 = buffer[uVar10];
                      if (0x3f < (ulong)bVar1) {
                        local_5c = 3;
                        goto LAB_002491d2;
                      }
                      buffer[uVar10] = '\0';
                      P[uVar12] = (FT_Char *)(buffer + uVar10 + 1);
                      uVar10 = uVar10 + bVar1 + 1;
                      uVar12 = uVar12 + 1;
                    } while ((uVar10 < uVar13) && (uVar12 < uVar7));
                    buffer[uVar13] = '\0';
                    if (uVar12 < uVar7) goto LAB_002494d4;
                  }
                  goto LAB_002493b4;
                }
              }
              else {
                pFVar6 = local_58;
                memory = local_50;
                P = (FT_Char **)0x0;
              }
            }
            else {
              pFVar6 = local_58;
              P = (FT_Char **)0x0;
            }
            goto LAB_002491d2;
          }
          uVar9 = 0;
          local_48 = (FT_Char **)0x0;
          local_58 = pFVar6;
        }
LAB_002493b4:
        (face->postscript_names).names.format_20.num_glyphs = (FT_UShort)local_40;
        (face->postscript_names).names.format_20.num_names = uVar9;
        (face->postscript_names).names.format_20.glyph_indices = local_58;
        (face->postscript_names).names.format_20.glyph_names = local_48;
LAB_002493d1:
        FVar5 = 0;
        goto LAB_00249387;
      }
      P = (FT_Char **)0x0;
      buffer = (FT_Byte *)0x0;
      memory = local_50;
    }
LAB_002491d2:
    ft_mem_free(memory,P);
    ft_mem_free(memory,buffer);
  }
LAB_0024937e:
  ft_mem_free(memory,pFVar6);
  FVar5 = local_5c;
LAB_00249387:
  (face->postscript_names).loaded = '\x01';
  return FVar5;
}

Assistant:

static FT_Error
  load_post_names( TT_Face  face )
  {
    FT_Stream  stream;
    FT_Error   error;
    FT_Fixed   format;
    FT_ULong   post_len;


    /* get a stream for the face's resource */
    stream = face->root.stream;

    /* seek to the beginning of the PS names table */
    error = face->goto_table( face, TTAG_post, stream, &post_len );
    if ( error )
      goto Exit;

    format = face->postscript.FormatType;

    /* go to beginning of subtable */
    if ( FT_STREAM_SKIP( 32 ) )
      goto Exit;

    /* now read postscript table */
    if ( format == 0x00020000L && post_len >= 34 )
      error = load_format_20( face, stream, post_len - 32 );
    else if ( format == 0x00025000L && post_len >= 34 )
      error = load_format_25( face, stream, post_len - 32 );
    else
      error = FT_THROW( Invalid_File_Format );

    face->postscript_names.loaded = 1;

  Exit:
    return error;
  }